

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtcpserver.cpp
# Opt level: O1

void __thiscall QTcpServerPrivate::configureCreatedSocket(QTcpServerPrivate *this)

{
  (**(code **)(*(long *)this->socketEngine + 0x118))(this->socketEngine,4,1);
  return;
}

Assistant:

void QTcpServerPrivate::configureCreatedSocket()
{
#if defined(Q_OS_UNIX)
    // Under Unix, we want to be able to bind to the port, even if a socket on
    // the same address-port is in TIME_WAIT. Under Windows this is possible
    // anyway -- furthermore, the meaning of reusable on Windows is different:
    // it means that you can use the same address-port for multiple listening
    // sockets.
    // Don't abort though if we can't set that option. For example the socks
    // engine doesn't support that option, but that shouldn't prevent us from
    // trying to bind/listen.
    socketEngine->setOption(QAbstractSocketEngine::AddressReusable, 1);
#endif
}